

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emulator.cpp
# Opt level: O1

void __thiscall Emulator::Emulator(Emulator *this,string *_filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  Sound_Queue *this_00;
  
  this->_vptr_Emulator = (_func_int **)&PTR__Emulator_0011da28;
  paVar1 = &(this->filename).field_2;
  (this->filename)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (_filename->_M_dataplus)._M_p;
  paVar2 = &_filename->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&_filename->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->filename).field_2 + 8) = uVar4;
  }
  else {
    (this->filename)._M_dataplus._M_p = pcVar3;
    (this->filename).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->filename)._M_string_length = _filename->_M_string_length;
  (_filename->_M_dataplus)._M_p = (pointer)paVar2;
  _filename->_M_string_length = 0;
  (_filename->field_2)._M_local_buf[0] = '\0';
  SDL_Init(0xf231);
  SDL_SetHint("SDL_EMSCRIPTEN_KEYBOARD_ELEMENT","#canvas");
  SDL_CreateWindowAndRenderer(0x100,0xf0,0,&window,&renderer);
  SDL_SetWindowTitle(window,"NESEmulator");
  SDL_SetHint("SDL_RENDER_SCALE_QUALITY","linear");
  surface = (SDL_Surface *)SDL_CreateRGBSurface(0,0x100,0xf0,0x20,0,0,0,0);
  texture = (SDL_Texture *)SDL_CreateTexture(renderer,0x16362004,1,0x100,0xf0);
  SDL_RenderClear(renderer);
  vsyncEvent = SDL_RegisterEvents(1);
  this_00 = (Sound_Queue *)operator_new(0x20);
  Sound_Queue::Sound_Queue(this_00);
  sound_queue = this_00;
  Sound_Queue::init(this_00,(EVP_PKEY_CTX *)0xac44);
  ticks = SDL_GetTicks();
  return;
}

Assistant:

Emulator::Emulator(std::string _filename) : filename(move(_filename)) {
    SDL_Init(SDL_INIT_EVERYTHING);
    SDL_SetHint(SDL_HINT_EMSCRIPTEN_KEYBOARD_ELEMENT, "#canvas");
    SDL_CreateWindowAndRenderer(SCREEN_WIDTH, SCREEN_HEIGHT, 0, &window, &renderer);
    SDL_SetWindowTitle(window, "NESEmulator");
    SDL_SetHint(SDL_HINT_RENDER_SCALE_QUALITY, "linear");
    surface = SDL_CreateRGBSurface(0, SCREEN_WIDTH, SCREEN_HEIGHT, 32, 0, 0, 0, 0);
    texture = SDL_CreateTexture(renderer, SDL_PIXELFORMAT_ARGB8888, SDL_TEXTUREACCESS_STREAMING, SCREEN_WIDTH,
                                SCREEN_HEIGHT);
    SDL_RenderClear(renderer);
    vsyncEvent = SDL_RegisterEvents(1);
    sound_queue = new Sound_Queue;
    sound_queue->init(sample_rate);
    ticks = SDL_GetTicks();
}